

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCoreTryCompile.cxx
# Opt level: O0

Arguments * __thiscall
cmCoreTryCompile::ParseArgs
          (Arguments *__return_storage_ptr__,cmCoreTryCompile *this,
          cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
          args,bool isTryRun)

{
  string_view str;
  bool bVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  ulong uVar2;
  cmArgumentParser<cmCoreTryCompile::Arguments> *local_c0;
  cmArgumentParser<cmCoreTryCompile::Arguments> *local_b8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_58;
  reference local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *second;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  bool isTryRun_local;
  cmCoreTryCompile *this_local;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  args_local;
  Arguments *arguments;
  
  args_local.Begin = args.End._M_current;
  this_local = (cmCoreTryCompile *)args.Begin._M_current;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = isTryRun;
  args_local.End._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__return_storage_ptr__;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&second);
  local_58 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::begin((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&this_local);
  this_00 = __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_58);
  local_50 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(this_00);
  if (((unparsedArguments.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) &&
     (bVar1 = std::operator==(local_50,"PROJECT"), bVar1)) {
    ParseArgs(__return_storage_ptr__,this,
              (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
               *)&this_local,
              (cmArgumentParser<cmCoreTryCompile::Arguments> *)
              (anonymous_namespace)::TryCompileProjectArgParser,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&second);
    bVar1 = std::optional::operator_cast_to_bool
                      ((optional *)&__return_storage_ptr__->BinaryDirectory);
    if (!bVar1) {
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&__return_storage_ptr__->BinaryDirectory,
                 &(anonymous_namespace)::unique_binary_directory);
    }
  }
  else {
    str = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_50);
    bVar1 = cmHasLiteralPrefix<7ul>(str,(char (*) [7])0x100fcbd);
    if (bVar1) {
      if ((unparsedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        local_b8 = (cmArgumentParser<cmCoreTryCompile::Arguments> *)
                   (anonymous_namespace)::TryCompileSourcesArgParser;
      }
      else {
        local_b8 = (cmArgumentParser<cmCoreTryCompile::Arguments> *)
                   (anonymous_namespace)::TryRunSourcesArgParser;
      }
      ParseArgs(__return_storage_ptr__,this,
                (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&this_local,local_b8,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&second);
      std::optional<std::__cxx11::string>::operator=
                ((optional<std::__cxx11::string> *)&__return_storage_ptr__->BinaryDirectory,
                 &(anonymous_namespace)::unique_binary_directory);
    }
    else {
      if ((unparsedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
        local_c0 = (cmArgumentParser<cmCoreTryCompile::Arguments> *)
                   (anonymous_namespace)::TryCompileOldArgParser;
      }
      else {
        local_c0 = (cmArgumentParser<cmCoreTryCompile::Arguments> *)
                   (anonymous_namespace)::TryRunOldArgParser;
      }
      ParseArgs(__return_storage_ptr__,this,
                (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 *)&this_local,local_c0,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&second);
      bVar1 = std::optional::operator_cast_to_bool
                        ((optional *)&__return_storage_ptr__->OutputVariable);
      if (bVar1) {
        std::
        optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
        operator->(&__return_storage_ptr__->OutputVariable);
        uVar2 = std::__cxx11::string::empty();
        if ((uVar2 & 1) != 0) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator=(&__return_storage_ptr__->OutputVariable);
        }
      }
      if ((unparsedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)&__return_storage_ptr__->CompileOutputVariable);
        if (bVar1) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->(&__return_storage_ptr__->CompileOutputVariable);
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) != 0) {
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=(&__return_storage_ptr__->CompileOutputVariable);
          }
        }
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)&__return_storage_ptr__->RunOutputVariable);
        if (bVar1) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->(&__return_storage_ptr__->RunOutputVariable);
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) != 0) {
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=(&__return_storage_ptr__->RunOutputVariable);
          }
        }
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)&__return_storage_ptr__->RunOutputStdOutVariable);
        if (bVar1) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->(&__return_storage_ptr__->RunOutputStdOutVariable);
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) != 0) {
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=(&__return_storage_ptr__->RunOutputStdOutVariable);
          }
        }
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)&__return_storage_ptr__->RunOutputStdErrVariable);
        if (bVar1) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->(&__return_storage_ptr__->RunOutputStdErrVariable);
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) != 0) {
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=(&__return_storage_ptr__->RunOutputStdErrVariable);
          }
        }
        bVar1 = std::optional::operator_cast_to_bool
                          ((optional *)&__return_storage_ptr__->RunWorkingDirectory);
        if (bVar1) {
          std::
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator->(&__return_storage_ptr__->RunWorkingDirectory);
          uVar2 = std::__cxx11::string::empty();
          if ((uVar2 & 1) != 0) {
            std::
            optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator=(&__return_storage_ptr__->RunWorkingDirectory);
          }
        }
      }
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&second);
  return __return_storage_ptr__;
}

Assistant:

Arguments cmCoreTryCompile::ParseArgs(
  cmRange<std::vector<std::string>::const_iterator> args, bool isTryRun)
{
  std::vector<std::string> unparsedArguments;
  const auto& second = *(++args.begin());

  if (!isTryRun && second == "PROJECT") {
    // New PROJECT signature (try_compile only).
    auto arguments =
      this->ParseArgs(args, TryCompileProjectArgParser, unparsedArguments);
    if (!arguments.BinaryDirectory) {
      arguments.BinaryDirectory = unique_binary_directory;
    }
    return arguments;
  }

  if (cmHasLiteralPrefix(second, "SOURCE")) {
    // New SOURCES signature.
    auto arguments = this->ParseArgs(
      args, isTryRun ? TryRunSourcesArgParser : TryCompileSourcesArgParser,
      unparsedArguments);
    arguments.BinaryDirectory = unique_binary_directory;
    return arguments;
  }

  // Old signature.
  auto arguments = this->ParseArgs(
    args, isTryRun ? TryRunOldArgParser : TryCompileOldArgParser,
    unparsedArguments);
  // For historical reasons, treat some empty-valued keyword
  // arguments as if they were not specified at all.
  if (arguments.OutputVariable && arguments.OutputVariable->empty()) {
    arguments.OutputVariable = cm::nullopt;
  }
  if (isTryRun) {
    if (arguments.CompileOutputVariable &&
        arguments.CompileOutputVariable->empty()) {
      arguments.CompileOutputVariable = cm::nullopt;
    }
    if (arguments.RunOutputVariable && arguments.RunOutputVariable->empty()) {
      arguments.RunOutputVariable = cm::nullopt;
    }
    if (arguments.RunOutputStdOutVariable &&
        arguments.RunOutputStdOutVariable->empty()) {
      arguments.RunOutputStdOutVariable = cm::nullopt;
    }
    if (arguments.RunOutputStdErrVariable &&
        arguments.RunOutputStdErrVariable->empty()) {
      arguments.RunOutputStdErrVariable = cm::nullopt;
    }
    if (arguments.RunWorkingDirectory &&
        arguments.RunWorkingDirectory->empty()) {
      arguments.RunWorkingDirectory = cm::nullopt;
    }
  }
  return arguments;
}